

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::handleSemantic
          (HlslParseContext *this,TSourceLoc loc,TQualifier *qualifier,TBuiltInVariable builtIn,
          TString *upperCase)

{
  EShLanguage EVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  anon_class_32_2_633b926d getSemanticNumber;
  
  getSemanticNumber.loc.name = loc.name;
  getSemanticNumber.loc.string = loc.string;
  getSemanticNumber.loc.line = loc.line;
  getSemanticNumber.loc.column = loc.column;
  getSemanticNumber.loc._20_4_ = loc._20_4_;
  getSemanticNumber.this = this;
  if (builtIn == EbvNone) {
    if (((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgHlslDX9Compatible) !=
        EShMsgDefault) {
      EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
      if (EVar1 == EShLangFragment) {
        uVar4 = *(uint *)&qualifier->field_0x8 & 0x7f;
        builtIn = EbvNone;
        if ((uVar4 < 0x14) && ((0xd0000U >> (*(uint *)&qualifier->field_0x8 & 0x1f) & 1) != 0)) {
          bVar2 = std::operator==(upperCase,"VPOS");
          builtIn = EbvNone;
          if (bVar2) {
            builtIn = EbvFragCoord;
          }
          uVar4 = *(uint *)&qualifier->field_0x8 & 0x7f;
        }
        if (uVar4 - 0x11 < 2) {
          iVar3 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(upperCase,0,5,"COLOR");
          if (iVar3 == 0) {
            uVar4 = handleSemantic::anon_class_32_2_633b926d::operator()
                              (&getSemanticNumber,upperCase,0,(char *)0x0);
            *(ulong *)&qualifier->field_0x1c =
                 *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)(uVar4 & 0xfff);
            uVar4 = (uVar4 & 0xfff) + 1;
            if (uVar4 < this->nextOutLocation) {
              uVar4 = this->nextOutLocation;
            }
            this->nextOutLocation = uVar4;
          }
          bVar2 = std::operator==(upperCase,"DEPTH");
          if (bVar2) {
            builtIn = EbvFragDepth;
            goto LAB_00322252;
          }
        }
      }
      else {
        if ((EVar1 != EShLangVertex) || (1 < (*(uint *)&qualifier->field_0x8 & 0x7f) - 0x11))
        goto LAB_00322150;
        bVar2 = std::operator==(upperCase,"POSITION");
        builtIn = EbvNone;
        if (bVar2) {
          builtIn = EbvPosition;
        }
        bVar2 = std::operator==(upperCase,"PSIZE");
        if (bVar2) {
          builtIn = EbvPointSize;
          goto LAB_00322252;
        }
      }
      goto LAB_003220c4;
    }
  }
  else {
LAB_003220c4:
    if (builtIn - EbvTessLevelOuter < 2) {
      qualifier->field_0xd = qualifier->field_0xd | 0x10;
      goto LAB_00322252;
    }
    if (builtIn == EbvFragStencilRef) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,&loc,"unimplemented; need ARB_shader_stencil_export","SV_STENCILREF","");
      builtIn = EbvFragStencilRef;
      goto LAB_00322252;
    }
    if (builtIn == EbvPosition) {
      builtIn = EbvPosition;
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
        builtIn = EbvFragCoord;
      }
      goto LAB_00322252;
    }
    if (builtIn != EbvNone) goto LAB_00322252;
  }
LAB_00322150:
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(upperCase,0,9,"SV_TARGET");
    if (iVar3 == 0) {
      uVar4 = handleSemantic::anon_class_32_2_633b926d::operator()
                        (&getSemanticNumber,upperCase,0,(char *)0x0);
      *(ulong *)&qualifier->field_0x1c =
           *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)(uVar4 & 0xfff);
      uVar4 = (uVar4 & 0xfff) + 1;
      if (uVar4 < this->nextOutLocation) {
        uVar4 = this->nextOutLocation;
      }
      this->nextOutLocation = uVar4;
      builtIn = EbvNone;
      goto LAB_00322252;
    }
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(upperCase,0,0xf,"SV_CLIPDISTANCE");
  if (iVar3 == 0) {
    uVar4 = handleSemantic::anon_class_32_2_633b926d::operator()
                      (&getSemanticNumber,upperCase,2,"invalid clip semantic");
    *(ulong *)&qualifier->field_0x1c =
         *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)(uVar4 & 0xfff);
    builtIn = EbvClipDistance;
  }
  else {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(upperCase,0,0xf,"SV_CULLDISTANCE");
    builtIn = EbvNone;
    if (iVar3 == 0) {
      uVar4 = handleSemantic::anon_class_32_2_633b926d::operator()
                        (&getSemanticNumber,upperCase,2,"invalid cull semantic");
      *(ulong *)&qualifier->field_0x1c =
           *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)(uVar4 & 0xfff);
      builtIn = EbvCullDistance;
    }
  }
LAB_00322252:
  if ((*(ulong *)&qualifier->field_0x8 & 0xff80) == 0) {
    *(ulong *)&qualifier->field_0x8 =
         *(ulong *)&qualifier->field_0x8 | (ulong)((builtIn & 0x1ff) << 7);
  }
  pcVar5 = TIntermediate::addSemanticName
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,upperCase);
  qualifier->semanticName = pcVar5;
  return;
}

Assistant:

void HlslParseContext::handleSemantic(TSourceLoc loc, TQualifier& qualifier, TBuiltInVariable builtIn,
                                      const TString& upperCase)
{
    // Parse and return semantic number.  If limit is 0, it will be ignored.  Otherwise, if the parsed
    // semantic number is >= limit, errorMsg is issued and 0 is returned.
    // TODO: it would be nicer if limit and errorMsg had default parameters, but some compilers don't yet
    // accept those in lambda functions.
    const auto getSemanticNumber = [this, loc](const TString& semantic, unsigned int limit, const char* errorMsg) -> unsigned int {
        size_t pos = semantic.find_last_not_of("0123456789");
        if (pos == std::string::npos)
            return 0u;

        unsigned int semanticNum = (unsigned int)atoi(semantic.c_str() + pos + 1);

        if (limit != 0 && semanticNum >= limit) {
            error(loc, errorMsg, semantic.c_str(), "");
            return 0u;
        }

        return semanticNum;
    };

    if (builtIn == EbvNone && hlslDX9Compatible()) {
        if (language == EShLangVertex) {
            if (qualifier.isParamOutput()) {
                if (upperCase == "POSITION") {
                    builtIn = EbvPosition;
                }
                if (upperCase == "PSIZE") {
                    builtIn = EbvPointSize;
                }
            }
        } else if (language == EShLangFragment) {
            if (qualifier.isParamInput() && upperCase == "VPOS") {
                builtIn = EbvFragCoord;
            }
            if (qualifier.isParamOutput()) {
                if (upperCase.compare(0, 5, "COLOR") == 0) {
                    qualifier.layoutLocation = getSemanticNumber(upperCase, 0, nullptr);
                    nextOutLocation = std::max(nextOutLocation, qualifier.layoutLocation + 1u);
                }
                if (upperCase == "DEPTH") {
                    builtIn = EbvFragDepth;
                }
            }
        }
    }

    switch(builtIn) {
    case EbvNone:
        // Get location numbers from fragment outputs, instead of
        // auto-assigning them.
        if (language == EShLangFragment && upperCase.compare(0, 9, "SV_TARGET") == 0) {
            qualifier.layoutLocation = getSemanticNumber(upperCase, 0, nullptr);
            nextOutLocation = std::max(nextOutLocation, qualifier.layoutLocation + 1u);
        } else if (upperCase.compare(0, 15, "SV_CLIPDISTANCE") == 0) {
            builtIn = EbvClipDistance;
            qualifier.layoutLocation = getSemanticNumber(upperCase, maxClipCullRegs, "invalid clip semantic");
        } else if (upperCase.compare(0, 15, "SV_CULLDISTANCE") == 0) {
            builtIn = EbvCullDistance;
            qualifier.layoutLocation = getSemanticNumber(upperCase, maxClipCullRegs, "invalid cull semantic");
        }
        break;
    case EbvPosition:
        // adjust for stage in/out
        if (language == EShLangFragment)
            builtIn = EbvFragCoord;
        break;
    case EbvFragStencilRef:
        error(loc, "unimplemented; need ARB_shader_stencil_export", "SV_STENCILREF", "");
        break;
    case EbvTessLevelInner:
    case EbvTessLevelOuter:
        qualifier.patch = true;
        break;
    default:
        break;
    }

    if (qualifier.builtIn == EbvNone)
        qualifier.builtIn = builtIn;
    qualifier.semanticName = intermediate.addSemanticName(upperCase);
}